

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall cmCTest::CheckArgument(cmCTest *this,string *arg,string_view varg1,char *varg2)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar1;
  undefined1 local_4a;
  undefined1 local_49;
  char *varg2_local;
  string *arg_local;
  string_view varg1_local;
  
  __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
        std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
  __y._M_str = (char *)varg1._M_len;
  __y._M_len = (size_t)arg;
  bVar1 = std::operator==(__x,__y);
  local_49 = true;
  if (!bVar1) {
    local_4a = false;
    if (varg1._M_str != (char *)0x0) {
      local_4a = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)this,varg1._M_str);
    }
    local_49 = local_4a;
  }
  return local_49;
}

Assistant:

bool cmCTest::CheckArgument(const std::string& arg, cm::string_view varg1,
                            const char* varg2)
{
  return (arg == varg1) || (varg2 && arg == varg2);
}